

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O2

offset_type unicpp::get_codepoint_distance(string *str,const_iterator *b,const_iterator *it)

{
  offset_type oVar1;
  
  oVar1 = std::
          __distance<unicpp::codepoint_iterator<std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    (b->internal_string,(b->internal_it)._M_current,it->internal_string,
                     (it->internal_it)._M_current);
  return oVar1;
}

Assistant:

as_codepoints::offset_type get_codepoint_distance(const string & str, const as_codepoints::const_iterator & b, const as_codepoints::const_iterator & it)
{
    return std::distance(b, it);
}